

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stagewise_poly.cc
# Opt level: O0

void end_pass(stagewise_poly *poly)

{
  vw *all_00;
  long *in_RDI;
  float fVar1;
  vw *all;
  uint64_t num_examples_inc;
  uint64_t sum_input_sparsity_inc;
  uint64_t sum_sparsity_inc;
  float in_stack_ffffffffffffff8c;
  vw *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  float fVar2;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  
  if ((*(int *)((long)in_RDI + 0xc) == 0) &&
     ((*(long *)(*in_RDI + 0x20) == 0 || ((ulong)in_RDI[0xd2b] < 2)))) {
    local_10 = in_RDI[6] - in_RDI[9];
    local_18 = in_RDI[7] - in_RDI[10];
    local_20 = in_RDI[8] - in_RDI[0xb];
    all_00 = (vw *)*in_RDI;
    if (all_00->all_reduce != (AllReduce *)0x0) {
      depthsbits_sizeof((stagewise_poly *)0x2a31c6);
      all_reduce<unsigned_char,_&reduce_min_max>
                ((vw *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (uchar *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (size_t)in_stack_ffffffffffffff90);
      fVar1 = accumulate_scalar(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      fVar2 = 9.223372e+18;
      local_18 = (long)fVar1 | (long)(fVar1 - 9.223372e+18) & (long)fVar1 >> 0x3f;
      fVar1 = accumulate_scalar(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      local_10 = (long)fVar1 | (long)(fVar1 - fVar2) & (long)fVar1 >> 0x3f;
      fVar1 = accumulate_scalar(all_00,in_stack_ffffffffffffff8c);
      local_20 = (long)fVar1 | (long)(fVar1 - fVar2) & (long)fVar1 >> 0x3f;
    }
    in_RDI[10] = in_RDI[10] + local_18;
    in_RDI[7] = in_RDI[10];
    in_RDI[9] = in_RDI[9] + local_10;
    in_RDI[6] = in_RDI[9];
    in_RDI[0xb] = in_RDI[0xb] + local_20;
    in_RDI[8] = in_RDI[0xb];
    if (in_RDI[0xd2b] != *(long *)(*in_RDI + 0x348)) {
      *(undefined1 *)((long)in_RDI + 0x6964) = 1;
      in_RDI[0xd2b] = in_RDI[0xd2b] + 1;
    }
  }
  return;
}

Assistant:

void end_pass(stagewise_poly &poly)
{
  if (!!poly.batch_sz || (poly.all->all_reduce != nullptr && poly.numpasses > 1))
    return;

  uint64_t sum_sparsity_inc = poly.sum_sparsity - poly.sum_sparsity_sync;
  uint64_t sum_input_sparsity_inc = poly.sum_input_sparsity - poly.sum_input_sparsity_sync;
  uint64_t num_examples_inc = poly.num_examples - poly.num_examples_sync;

#ifdef DEBUG
  cout << "Sanity before allreduce\n";
  sanity_check_state(poly);
#endif  // DEBUG

  vw &all = *poly.all;
  if (all.all_reduce != nullptr)
  {
    /*
     * The following is inconsistent with the transplant code in
     * synthetic_create_rec(), which clears parent bits on depth mismatches.
     * But it's unclear what the right behavior is in general for either
     * case...
     */
    all_reduce<uint8_t, reduce_min_max>(all, poly.depthsbits, depthsbits_sizeof(poly));

    sum_input_sparsity_inc = (uint64_t)accumulate_scalar(all, (float)sum_input_sparsity_inc);
    sum_sparsity_inc = (uint64_t)accumulate_scalar(all, (float)sum_sparsity_inc);
    num_examples_inc = (uint64_t)accumulate_scalar(all, (float)num_examples_inc);
  }

  poly.sum_input_sparsity_sync = poly.sum_input_sparsity_sync + sum_input_sparsity_inc;
  poly.sum_input_sparsity = poly.sum_input_sparsity_sync;
  poly.sum_sparsity_sync = poly.sum_sparsity_sync + sum_sparsity_inc;
  poly.sum_sparsity = poly.sum_sparsity_sync;
  poly.num_examples_sync = poly.num_examples_sync + num_examples_inc;
  poly.num_examples = poly.num_examples_sync;

#ifdef DEBUG
  cout << "Sanity after allreduce\n";
  sanity_check_state(poly);
#endif  // DEBUG

  if (poly.numpasses != poly.all->numpasses)
  {
    poly.update_support = true;
    poly.numpasses++;
  }
}